

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * kwssys::regnext(char *p)

{
  int iVar1;
  int offset;
  char *p_local;
  char *local_8;
  
  if (p == &regdummy) {
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = (uint)(byte)p[1] * 0x100 + (uint)(byte)p[2];
    if (iVar1 == 0) {
      local_8 = (char *)0x0;
    }
    else if (*p == '\a') {
      local_8 = p + -(long)iVar1;
    }
    else {
      local_8 = p + iVar1;
    }
  }
  return local_8;
}

Assistant:

static const char* regnext(const char* p)
{
  int offset;

  if (p == regdummyptr)
    return (nullptr);

  offset = NEXT(p);
  if (offset == 0)
    return (nullptr);

  if (OP(p) == BACK)
    return (p - offset);
  else
    return (p + offset);
}